

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * d_dup_pathname_str(char *s)

{
  size_t sVar1;
  char *pcVar2;
  
  if (s == (char *)0x0) {
    s = "";
    pcVar2 = (char *)0x0;
  }
  else if (*s == '\"') {
    s = s + 1;
    for (pcVar2 = s; (*pcVar2 != '\0' && (*pcVar2 != '\"')); pcVar2 = pcVar2 + 1) {
    }
  }
  else {
    sVar1 = strlen(s);
    pcVar2 = s + sVar1;
  }
  pcVar2 = dup_str(s,pcVar2);
  return pcVar2;
}

Assistant:

char *d_dup_pathname_str(const char *s) {
  const char *e = s;
  if (!s) return dup_str("", 0);
  if (*e == '"') {
    e++;
    while (*e && *e != '"') e++;
    return dup_str(s + 1, e);
  } else
    return dup_str(s, s + strlen(s));
}